

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O2

uint32_t FastPForLib::Simple8b_Codec::tryRunLength(uint32_t *input,uint32_t pos,uint32_t count)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  
  uVar3 = count + pos;
  uVar4 = pos;
  uVar2 = pos + 1;
  if (pos + 1 < uVar3) {
    uVar2 = uVar3;
  }
  do {
    uVar4 = uVar4 + 1;
    uVar5 = uVar2;
    if (uVar3 <= uVar4) break;
    uVar5 = uVar4;
  } while (input[pos] == input[uVar4]);
  uVar1 = bits(input[pos] | 1);
  uVar4 = 0;
  if (0x3b < uVar1 * (uVar5 - pos)) {
    uVar4 = uVar5 - pos;
  }
  return uVar4;
}

Assistant:

static uint32_t tryRunLength(const uint32_t *input, uint32_t pos,
                               uint32_t count) {
    uint32_t startPos = pos;
    uint32_t endPos = pos + count;
    uint32_t test = input[pos++];
    if (test > RLE_MAX_VALUE_MASK)
      return 0;
    while (pos < endPos && test == input[pos]) {
      pos++;
    }
    uint32_t bitLen = bits(test | 1U);
    uint32_t repeatCount = (pos - startPos);
    return (bitLen * repeatCount >= SIMPLE8B_BITSIZE) ? repeatCount : 0;
  }